

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_split(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar15 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar15 != 0) {
    lVar15 = lVar15 >> 3;
    uVar14 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar14]->type);
      if (iVar5 == 0) {
        pLVar3 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        lVar8 = *(long *)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        uVar6 = 0;
        lVar9 = (long)*(pointer *)
                       ((long)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) - lVar8;
        if (lVar9 == 0) {
          lVar8 = -1;
        }
        else {
          lVar9 = lVar9 >> 2;
          uVar12 = 0xffffffff;
          uVar13 = 0;
          do {
            bVar16 = (((this->super_ModelWriter).blobs)->
                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                     super__Vector_impl_data._M_start[*(int *)(lVar8 + uVar13 * 4)].consumer != -1;
            if (bVar16) {
              uVar12 = uVar13 & 0xffffffff;
            }
            uVar6 = uVar6 + bVar16;
            uVar13 = uVar13 + 1;
          } while (lVar9 + (ulong)(lVar9 == 0) != uVar13);
          uVar6 = (uint)(1 < uVar6);
          lVar8 = (long)(int)uVar12;
        }
        if ((char)uVar6 == '\0') {
          iVar5 = (int)uVar14;
          uVar6 = iVar5 - 1;
          if ((int)uVar6 < 0) {
            lVar9 = -1;
          }
          else {
            iVar1 = *(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = uVar14 & 0xffffffff;
            do {
              uVar13 = (ulong)uVar6;
              iVar5 = (int)uVar12;
              iVar7 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
              if (iVar7 != 0) {
                pLVar4 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                lVar9 = *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data;
                iVar7 = -1;
                lVar10 = (long)*(pointer *)
                                ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl + 8) - lVar9;
                if (lVar10 != 0) {
                  lVar10 = lVar10 >> 2;
                  lVar11 = 0;
                  do {
                    if (*(int *)(lVar9 + lVar11 * 4) == iVar1) {
                      iVar7 = (int)lVar11;
                      break;
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
                }
                if (iVar7 != -1) goto LAB_0016ad76;
              }
              bVar16 = 0 < (int)uVar6;
              uVar12 = uVar13;
              uVar6 = uVar6 - 1;
            } while (bVar16);
            uVar6 = 0xffffffff;
            iVar5 = 0;
            iVar7 = -1;
LAB_0016ad76:
            lVar9 = (long)iVar7;
          }
          if (iVar5 != 0) {
            pLVar4 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar6];
            fprintf(_stderr,"eliminate_split %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                    (pLVar3->name)._M_dataplus._M_p);
            iVar5 = *(int *)(*(long *)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + lVar8 * 4);
            *(int *)(*(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + lVar9 * 4) = iVar5;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar5].producer = uVar6;
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x55a19a);
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != lVar15 + (ulong)(lVar15 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_split()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Split")
            continue;

        ncnn::Layer* split = layers[i];

        int real_split_output_count = 0;
        int real_split_top_blob_index = -1;
        size_t top_blob_count = split->tops.size();
        for (size_t j = 0; j < top_blob_count; j++)
        {
            int top_blob_index_final = split->tops[j];
            if (blobs[top_blob_index_final].consumer != -1)
            {
                real_split_output_count += 1;
                real_split_top_blob_index = j;
            }
        }

        if (real_split_output_count > 1)
            continue;

        // Any - Pooling
        int bottom_blob_index = split->bottoms[0];

        int top_i = -1;
        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            for (size_t k = 0; k < layers[j]->tops.size(); k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    top_i = k;
                    break;
                }
            }

            if (top_i != -1)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_split %s %s\n", any->name.c_str(), split->name.c_str());

        int top_blob_index_final = split->tops[real_split_top_blob_index];
        any->tops[top_i] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        split->type = "ncnnfused";
    }

    return 0;
}